

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

void __thiscall FileReaderZ::FileReaderZ(FileReaderZ *this,FileReader *file,bool zip)

{
  int iVar1;
  char *in_RAX;
  undefined7 in_register_00000011;
  FString local_18;
  
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderZ_006ef170;
  this->File = file;
  this->SawEOF = false;
  local_18.Chars = in_RAX;
  FillBuffer(this);
  (this->Stream).zalloc = (alloc_func)0x0;
  (this->Stream).zfree = (free_func)0x0;
  if ((int)CONCAT71(in_register_00000011,zip) == 0) {
    iVar1 = inflateInit_(&this->Stream,"1.2.11",0x70);
  }
  else {
    iVar1 = inflateInit2_(&this->Stream,0xfffffffffffffff1,"1.2.11",0x70);
  }
  if (iVar1 != 0) {
    M_ZLibError((int)&local_18);
    I_Error("FileReaderZ: inflateInit failed: %s\n",local_18.Chars);
    FString::~FString(&local_18);
  }
  return;
}

Assistant:

FileReaderZ::FileReaderZ (FileReader &file, bool zip)
: File(file), SawEOF(false)
{
	int err;

	FillBuffer ();

	Stream.zalloc = Z_NULL;
	Stream.zfree = Z_NULL;

	if (!zip) err = inflateInit (&Stream);
	else err = inflateInit2 (&Stream, -MAX_WBITS);

	if (err != Z_OK)
	{
		I_Error ("FileReaderZ: inflateInit failed: %s\n", M_ZLibError(err).GetChars());
	}
}